

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

void __thiscall
Js::PolymorphicInlineCache::CacheAccessor
          (PolymorphicInlineCache *this,bool isGetter,PropertyId propertyId,
          PropertyIndex propertyIndex,bool isInlineSlot,Type *type,DynamicObject *object,
          bool isOnProto,ScriptContext *requestContext)

{
  Type *pTVar1;
  bool bVar2;
  PropertyRecord *pPVar3;
  InlineCache *this_00;
  uint inlineCacheIndex;
  ulong uVar4;
  
  uVar4 = (ulong)this->size + 0xffffffff & (ulong)type >> 6;
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,CloneCacheInCollisionPhase);
  inlineCacheIndex = (uint)uVar4;
  if (!bVar2) {
    pTVar1 = this->inlineCaches[uVar4 & 0xffffffff].u.local.type;
    if (pTVar1 != (Type *)0x0) {
      this_00 = this->inlineCaches + (uVar4 & 0xffffffff);
      bVar2 = InlineCache::NeedsToBeRegisteredForStoreFieldInvalidation(this_00);
      if ((!bVar2) && (this->size != 1)) {
        if ((undefined1  [24])((undefined1  [24])this_00->u & (undefined1  [24])0x1) ==
            (undefined1  [24])0x0) {
          if (((ulong)pTVar1 & 1) == 0) {
            CloneInlineCacheToEmptySlotInCollision<false,false,true>(this,type,inlineCacheIndex);
          }
          else {
            CloneInlineCacheToEmptySlotInCollision<false,true,false>(this,type,inlineCacheIndex);
          }
        }
        else {
          CloneInlineCacheToEmptySlotInCollision<true,false,false>(this,type,inlineCacheIndex);
        }
      }
    }
  }
  InlineCache::CacheAccessor
            (this->inlineCaches + (uVar4 & 0xffffffff),isGetter,propertyId,propertyIndex,
             isInlineSlot,type,object,isOnProto,requestContext);
  UpdateInlineCachesFillInfo(this,inlineCacheIndex,true);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,PolymorphicInlineCachePhase);
  if ((bVar2) && (DAT_0145948a == '\x01')) {
    pPVar3 = ScriptContext::GetPropertyName(requestContext,propertyId);
    Output::Print(L"PIC::CacheAccessor, %s, %d: ",pPVar3 + 1,uVar4 & 0xffffffff);
    InlineCache::Dump(this->inlineCaches + (uVar4 & 0xffffffff));
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CacheAccessor(
        const bool isGetter,
        const PropertyId propertyId,
        const PropertyIndex propertyIndex,
        const bool isInlineSlot,
        Type *const type,
        DynamicObject *const object,
        const bool isOnProto,
        ScriptContext *const requestContext)
    {
        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
#if INTRUSIVE_TESTTRACE_PolymorphicInlineCache
        bool collision = !inlineCaches[inlineCacheIndex].IsEmpty();
#endif
        if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
        {
            if (!inlineCaches[inlineCacheIndex].IsEmpty() && !inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
            {
                if (inlineCaches[inlineCacheIndex].IsLocal())
                {
                    CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                }
                else if (inlineCaches[inlineCacheIndex].IsProto())
                {
                    CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                }
                else
                {
                    CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                }
            }
        }

        inlineCaches[inlineCacheIndex].CacheAccessor(isGetter, propertyId, propertyIndex, isInlineSlot, type, object, isOnProto, requestContext);
        UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("PIC::CacheAccessor, %s, %d: "), requestContext->GetPropertyName(propertyId)->GetBuffer(), inlineCacheIndex);
            inlineCaches[inlineCacheIndex].Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
        PHASE_PRINT_INTRUSIVE_TESTTRACE1(
            Js::PolymorphicInlineCachePhase,
            _u("TestTrace PIC: CacheAccessor, 0x%x, entryIndex = %d, collision = %s, entries = %d\n"), this, inlineCacheIndex, collision ? _u("true") : _u("false"), GetEntryCount());
    }